

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O1

uint8_t __thiscall llvm::DWARFContext::getCUAddrSize(DWARFContext *this)

{
  uint8_t uVar1;
  uint uVar2;
  
  parseNormalUnits(this);
  uVar2 = (this->NormalUnits).NumInfoUnits;
  if (uVar2 == 0xffffffff) {
    uVar2 = (this->NormalUnits).
            super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
            .
            super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
            .
            super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
            .
            super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
            .super_SmallVectorBase.Size;
  }
  if (uVar2 == 0) {
    uVar1 = '\0';
  }
  else {
    uVar1 = *(uint8_t *)
             (*(this->NormalUnits).
               super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
               .
               super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
               .
               super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
               .
               super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
               .super_SmallVectorBase.BeginX + 0x22);
  }
  return uVar1;
}

Assistant:

uint8_t DWARFContext::getCUAddrSize() {
  // In theory, different compile units may have different address byte
  // sizes, but for simplicity we just use the address byte size of the
  // last compile unit. In practice the address size field is repeated across
  // various DWARF headers (at least in version 5) to make it easier to dump
  // them independently, not to enable varying the address size.
  uint8_t Addr = 0;
  for (const auto &CU : compile_units()) {
    Addr = CU->getAddressByteSize();
    break;
  }
  return Addr;
}